

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginChildFrame(ImGuiID id,ImVec2 *size,ImGuiWindowFlags extra_flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  
  pIVar1 = GImGui;
  PushStyleColor(3,(GImGui->Style).Colors + 7);
  PushStyleVar(7,(pIVar1->Style).FrameRounding);
  PushStyleVar(8,(pIVar1->Style).FrameBorderSize);
  PushStyleVar(2,&(pIVar1->Style).FramePadding);
  bVar2 = BeginChild(id,size,true,extra_flags | 0x10004);
  PopStyleVar(3);
  PopStyleColor(1);
  return bVar2;
}

Assistant:

bool ImGui::BeginChildFrame(ImGuiID id, const ImVec2& size, ImGuiWindowFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    PushStyleColor(ImGuiCol_ChildBg, style.Colors[ImGuiCol_FrameBg]);
    PushStyleVar(ImGuiStyleVar_ChildRounding, style.FrameRounding);
    PushStyleVar(ImGuiStyleVar_ChildBorderSize, style.FrameBorderSize);
    PushStyleVar(ImGuiStyleVar_WindowPadding, style.FramePadding);
    bool ret = BeginChild(id, size, true, ImGuiWindowFlags_NoMove | ImGuiWindowFlags_AlwaysUseWindowPadding | extra_flags);
    PopStyleVar(3);
    PopStyleColor();
    return ret;
}